

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.c
# Opt level: O0

void free_bucket(VarHTItem *bucket)

{
  var_table_item_t *pvVar1;
  VarHTItem *next;
  VarHTItem *item;
  VarHTItem *bucket_local;
  
  next = bucket;
  while (next != (VarHTItem *)0x0) {
    pvVar1 = next->next;
    free(next);
    next = pvVar1;
  }
  return;
}

Assistant:

static void free_bucket(HTItem *bucket, void(free_callback)(HTItem *)) {
    HTItem *item = bucket;
    while (item) {
        HTItem *next = item->next;
        free_callback(item);
        item = next;
    }
}